

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O1

void Fl_Button::key_release_timeout(void *d)

{
  Fl_Button *this;
  Fl_Widget_Tracker *wt;
  
  if (d != (void *)0x0) {
    if (key_release_tracker == (Fl_Widget_Tracker *)d) {
      key_release_tracker = (Fl_Widget_Tracker *)0x0;
    }
    this = *d;
    if (this != (Fl_Button *)0x0) {
      value(this,0);
      Fl_Widget::redraw(&this->super_Fl_Widget);
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker((Fl_Widget_Tracker *)d);
    operator_delete(d,8);
    return;
  }
  return;
}

Assistant:

void Fl_Button::key_release_timeout(void *d)
{
  Fl_Widget_Tracker *wt = (Fl_Widget_Tracker*)d;
  if (!wt)
    return;
  if (wt==key_release_tracker)
    key_release_tracker = 0L;
  Fl_Button *btn = (Fl_Button*)wt->widget();
  if (btn) {
    btn->value(0);
    btn->redraw();
  }
  delete wt;
}